

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RangeSelectSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RangeSelectSyntax,slang::syntax::RangeSelectSyntax_const&>
          (BumpAllocator *this,RangeSelectSyntax *args)

{
  RangeSelectSyntax *__dest;
  void *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  __dest = (RangeSelectSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  memcpy(__dest,in_RSI,0x38);
  return __dest;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }